

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O0

void mzd_addmul_v_s128_129(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  undefined1 (*pauVar9) [16];
  ulong *puVar10;
  long in_RDX;
  ulong *in_RSI;
  ulong *in_RDI;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint i_1;
  word idx_1;
  uint w;
  word idx;
  word128 cval [4];
  block_t *Ablock;
  word *vptr;
  block_t *cblock;
  uint i_3;
  uint i_2;
  uint i;
  int local_2c4;
  word local_2c0;
  int local_2b4;
  ulong local_2a8 [4];
  ulong local_288 [5];
  ulong *local_260;
  ulong *local_258;
  ulong *local_1f8;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  uint local_180;
  undefined4 local_17c;
  ulong local_178;
  ulong uStack_170;
  long local_160;
  ulong *local_158;
  undefined1 (*local_150) [16];
  undefined1 local_148 [16];
  ulong local_138;
  ulong uStack_130;
  uint local_120;
  undefined4 local_11c;
  ulong local_118;
  ulong uStack_110;
  long local_100;
  ulong *local_f8;
  undefined1 (*local_f0) [16];
  undefined1 local_e8 [16];
  ulong local_d8;
  ulong uStack_d0;
  uint local_c0;
  undefined4 local_bc;
  ulong local_b8;
  ulong uStack_b0;
  long local_a0;
  ulong *local_98;
  undefined1 (*local_90) [16];
  undefined1 local_88 [16];
  ulong local_78;
  ulong uStack_70;
  ulong local_68;
  ulong uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  ulong local_48;
  ulong uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  ulong local_28;
  ulong uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_2a8[0] = *in_RDI;
  local_2a8[1] = in_RDI[1];
  local_1f8 = in_RDI + 2;
  local_2a8[2] = *local_1f8;
  local_2a8[3] = in_RDI[3];
  local_198 = (undefined1  [16])0x0;
  local_288[0] = 0;
  local_288[1] = 0;
  local_1a8 = (undefined1  [16])0x0;
  local_1a8._0_8_ = 0;
  local_1a8._8_8_ = 0;
  local_288[2] = 0;
  local_288[3] = 0;
  lVar8 = in_RDX + 0x7e0;
  uVar11 = local_1a8._0_8_;
  uVar13 = local_1a8._8_8_;
  local_288[4] = lVar8;
  local_260 = in_RSI;
  local_258 = in_RDI;
  mm128_compute_mask(*in_RSI >> 0x3f,0);
  local_bc = 2;
  uVar12 = uVar11;
  uVar14 = uVar13;
  for (local_c0 = 0; local_c0 != 2; local_c0 = local_c0 + 1) {
    uVar15 = local_2a8[(ulong)local_c0 * 2];
    uVar2 = local_2a8[(ulong)local_c0 * 2 + 1];
    pauVar9 = (undefined1 (*) [16])(lVar8 + (ulong)local_c0 * 0x10);
    uVar4 = *(undefined8 *)*pauVar9;
    uVar5 = *(undefined8 *)(*pauVar9 + 8);
    auVar6._8_8_ = uVar13;
    auVar6._0_8_ = uVar11;
    auVar1 = vpand_avx(*pauVar9,auVar6);
    local_88._0_8_ = auVar1._0_8_;
    local_88._8_8_ = auVar1._8_8_;
    uVar12 = uVar15 ^ local_88._0_8_;
    uVar14 = uVar2 ^ local_88._8_8_;
    local_2a8[(ulong)local_c0 * 2] = uVar12;
    local_2a8[(ulong)local_c0 * 2 + 1] = uVar14;
    local_90 = pauVar9;
    local_88 = auVar1;
    local_78 = uVar15;
    uStack_70 = uVar2;
    local_68 = uVar11;
    uStack_60 = uVar13;
    local_58 = uVar4;
    uStack_50 = uVar5;
  }
  local_288[4] = local_288[4] + 0x20;
  local_b8 = uVar11;
  uStack_b0 = uVar13;
  local_a0 = lVar8;
  local_98 = local_2a8;
  for (local_2b4 = 2; local_260 = local_260 + 1, local_2b4 != 0; local_2b4 = local_2b4 + -1) {
    local_2c0 = *local_260;
    for (local_2c4 = 0x40; uVar11 = local_288[4], local_2c4 != 0; local_2c4 = local_2c4 + -2) {
      mm128_compute_mask(local_2c0,0);
      local_100 = uVar11;
      local_11c = 2;
      uVar13 = uVar12;
      uVar15 = uVar14;
      for (local_120 = 0; local_120 != 2; local_120 = local_120 + 1) {
        uVar2 = local_2a8[(ulong)local_120 * 2];
        uVar3 = local_2a8[(ulong)local_120 * 2 + 1];
        pauVar9 = (undefined1 (*) [16])(uVar11 + (ulong)local_120 * 0x10);
        uVar4 = *(undefined8 *)*pauVar9;
        uVar5 = *(undefined8 *)(*pauVar9 + 8);
        auVar7._8_8_ = uVar14;
        auVar7._0_8_ = uVar12;
        auVar1 = vpand_avx(*pauVar9,auVar7);
        local_e8._0_8_ = auVar1._0_8_;
        local_e8._8_8_ = auVar1._8_8_;
        uVar13 = uVar2 ^ local_e8._0_8_;
        uVar15 = uVar3 ^ local_e8._8_8_;
        local_2a8[(ulong)local_120 * 2] = uVar13;
        local_2a8[(ulong)local_120 * 2 + 1] = uVar15;
        local_f0 = pauVar9;
        local_e8 = auVar1;
        local_d8 = uVar2;
        uStack_d0 = uVar3;
        local_48 = uVar12;
        uStack_40 = uVar14;
        local_38 = uVar4;
        uStack_30 = uVar5;
      }
      puVar10 = local_2a8 + 4;
      lVar8 = local_288[4] + 0x20;
      local_118 = uVar12;
      uStack_110 = uVar14;
      local_f8 = local_2a8;
      mm128_compute_mask(local_2c0,1);
      local_17c = 2;
      uVar12 = uVar13;
      uVar14 = uVar15;
      for (local_180 = 0; local_180 != 2; local_180 = local_180 + 1) {
        uVar11 = puVar10[(ulong)local_180 * 2];
        uVar2 = local_2a8[(ulong)local_180 * 2 + 5];
        pauVar9 = (undefined1 (*) [16])(lVar8 + (ulong)local_180 * 0x10);
        uVar4 = *(undefined8 *)*pauVar9;
        uVar5 = *(undefined8 *)(*pauVar9 + 8);
        auVar1._8_8_ = uVar15;
        auVar1._0_8_ = uVar13;
        auVar1 = vpand_avx(*pauVar9,auVar1);
        local_148._0_8_ = auVar1._0_8_;
        local_148._8_8_ = auVar1._8_8_;
        uVar12 = uVar11 ^ local_148._0_8_;
        uVar14 = uVar2 ^ local_148._8_8_;
        puVar10[(ulong)local_180 * 2] = uVar12;
        local_2a8[(ulong)local_180 * 2 + 5] = uVar14;
        local_150 = pauVar9;
        local_148 = auVar1;
        local_138 = uVar11;
        uStack_130 = uVar2;
        local_28 = uVar13;
        uStack_20 = uVar15;
        local_18 = uVar4;
        uStack_10 = uVar5;
      }
      local_2c0 = local_2c0 >> 2;
      local_288[4] = local_288[4] + 0x40;
      local_178 = uVar13;
      uStack_170 = uVar15;
      local_160 = lVar8;
      local_158 = puVar10;
    }
  }
  *local_258 = local_2a8[0] ^ local_288[0];
  local_258[1] = local_2a8[1] ^ local_288[1];
  local_258[2] = local_2a8[2] ^ local_288[2];
  local_258[3] = local_2a8[3] ^ local_288[3];
  return;
}

Assistant:

ATTR_TARGET_S128
void mzd_addmul_v_s128_129(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word128 cval[4] = {mm128_load(&cblock->w64[0]), mm128_load(&cblock->w64[2]), mm128_zero,
                     mm128_zero};
  {
    Ablock += 63;
    word idx = (*vptr) >> 63;
    mm128_xor_mask_region(&cval[0], Ablock[0].w64, mm128_compute_mask(idx, 0), 2);
    vptr++;
    Ablock++;
  }
  for (unsigned int w = 2; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; i -= 2, idx >>= 2, Ablock += 2) {
      mm128_xor_mask_region(&cval[0], Ablock[0].w64, mm128_compute_mask(idx, 0), 2);
      mm128_xor_mask_region(&cval[2], Ablock[1].w64, mm128_compute_mask(idx, 1), 2);
    }
  }
  mm128_store(&cblock->w64[0], mm128_xor(cval[0], cval[2]));
  mm128_store(&cblock->w64[2], mm128_xor(cval[1], cval[3]));
}